

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O1

void __thiscall
duckdb_apache::thrift::protocol::TProtocolDefaults::TProtocolDefaults
          (TProtocolDefaults *this,shared_ptr<duckdb_apache::thrift::transport::TTransport> *ptrans)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (ptrans->
           super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  this_00 = (ptrans->
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_TProtocol)._vptr_TProtocol = (_func_int **)&PTR__TProtocol_004a80e8;
    (this->super_TProtocol).ptrans_.
    super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->super_TProtocol).ptrans_.
    super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (this->super_TProtocol)._vptr_TProtocol = (_func_int **)&PTR__TProtocol_004a80e8;
    (this->super_TProtocol).ptrans_.
    super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->super_TProtocol).ptrans_.
    super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (this->super_TProtocol).input_recursion_depth_ = 0;
      (this->super_TProtocol).output_recursion_depth_ = 0;
      (this->super_TProtocol).recursion_limit_ = 0x40;
      goto LAB_002757c8;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (this->super_TProtocol).input_recursion_depth_ = 0;
  (this->super_TProtocol).output_recursion_depth_ = 0;
  (this->super_TProtocol).recursion_limit_ = 0x40;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_002757c8:
  (this->super_TProtocol)._vptr_TProtocol = (_func_int **)&PTR__TProtocol_004a3618;
  return;
}

Assistant:

TProtocolDefaults(std::shared_ptr<TTransport> ptrans) : TProtocol(ptrans) {}